

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O0

uint32_t unpackLE(uint8_t *p,uint8_t u8Size)

{
  uint32_t local_20;
  uint8_t local_19;
  uint32_t value;
  uint8_t u8Size_local;
  uint8_t *p_local;
  
  if ((u8Size == '\0') || (4 < u8Size)) {
    p_local._4_4_ = 0;
  }
  else {
    local_20 = 0;
    local_19 = u8Size;
    _value = p;
    memcpy(&local_20,p,(ulong)u8Size);
    p_local._4_4_ = local_20;
  }
  return p_local._4_4_;
}

Assistant:

_PACK_UINT32 unpackLE(const _PACK_UINT8* p, _PACK_UINT8 u8Size)
{
   if ((u8Size > 0) && (u8Size <= sizeof(_PACK_UINT32)))
   {
#if defined(PLATFORM_BYTE_ORDER) && (PLATFORM_BYTE_ORDER==PLATFORM_LITTLE_ENDIAN)
      _PACK_UINT32 value = 0u;
      memcpy(&value, p, u8Size);
      return value;
#else
      register _PACK_UINT32 tmp = 0;
      p += (u8Size - 1);
      while (u8Size > 0)
      {
         tmp = (tmp << 8) | *(p--);
         u8Size--;
      }
      return tmp;
#endif
   }
   return 0;
}